

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O3

ion_status_t bpptree_get(ion_dictionary_t *dictionary,ion_key_t key,ion_value_t value)

{
  ion_dictionary_parent_t *piVar1;
  byte bVar2;
  ion_bpp_err_t iVar3;
  ion_status_t iVar4;
  ion_status_t iVar5;
  ion_file_offset_t offset;
  ion_file_offset_t next;
  ion_file_offset_t local_20;
  ion_file_offset_t local_18;
  
  piVar1 = dictionary->instance;
  iVar3 = b_get(*(ion_bpp_handle_t *)(piVar1 + 1),key,&local_20);
  iVar4.error = '\x01';
  iVar4._1_3_ = 0;
  iVar4.count = 0;
  if (iVar3 == bErrOk) {
    bVar2 = lfb_get((ion_lfb_t *)&piVar1[1].record.value_size,local_20,(piVar1->record).value_size,
                    (ion_byte_t *)value,&local_18);
    iVar5._1_7_ = 0;
    iVar5.error = bVar2;
    iVar4.error = '\0';
    iVar4._1_3_ = 0;
    iVar4.count = 1;
    if (bVar2 != 0) {
      iVar4 = iVar5;
    }
  }
  return iVar4;
}

Assistant:

ion_status_t
bpptree_get(
	ion_dictionary_t	*dictionary,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_bpptree_t		*bpptree;
	ion_file_offset_t	offset;
	ion_file_offset_t	next;
	ion_bpp_err_t		bErr;
	ion_err_t			err;

	bpptree = (ion_bpptree_t *) dictionary->instance;

	bErr	= b_get(bpptree->tree, key, &offset);

	if (bErrOk != bErr) {
		return ION_STATUS_ERROR(err_item_not_found);
	}

	err = lfb_get(&(bpptree->values), offset, bpptree->super.record.value_size, (ion_byte_t *) value, &next);

	if (err_ok == err) {
		return ION_STATUS_OK(1);
	}

	return ION_STATUS_ERROR(err);
}